

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t terminal_telltc(EditLine *el,wchar_t argc,wchar_t **argv)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  char *pcVar3;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  termcapstr *ptVar7;
  
  fwrite("\n\tYour terminal has the\n",0x18,1,(FILE *)el->el_outfile);
  fwrite("\tfollowing characteristics:\n\n",0x1d,1,(FILE *)el->el_outfile);
  pwVar2 = (el->el_terminal).t_val;
  fprintf((FILE *)el->el_outfile,"\tIt has %d columns and %d lines\n",(ulong)(uint)pwVar2[3],
          (ulong)(uint)pwVar2[2]);
  pcVar3 = "a";
  if (((el->el_terminal).t_flags & L'@') == L'\0') {
    pcVar3 = "no";
  }
  fprintf((FILE *)el->el_outfile,"\tIt has %s meta key\n",pcVar3);
  pcVar3 = " ";
  if (((el->el_terminal).t_flags & L'\b') == L'\0') {
    pcVar3 = "not ";
  }
  fprintf((FILE *)el->el_outfile,"\tIt can%suse tabs\n",pcVar3);
  pcVar6 = "has";
  pcVar3 = "has";
  if (-1 < (char)(el->el_terminal).t_flags) {
    pcVar3 = "does not have";
  }
  fprintf((FILE *)el->el_outfile,"\tIt %s automatic margins\n",pcVar3);
  wVar1 = (el->el_terminal).t_flags;
  if ((char)wVar1 < '\0') {
    if (((uint)wVar1 >> 8 & 1) == 0) {
      pcVar6 = "does not have";
    }
    fprintf((FILE *)el->el_outfile,"\tIt %s magic margins\n",pcVar6);
  }
  ppcVar4 = (el->el_terminal).t_str;
  for (ptVar7 = tstr; pcVar3 = ptVar7->name, pcVar3 != (char *)0x0; ptVar7 = ptVar7 + 1) {
    pcVar6 = *ppcVar4;
    pcVar5 = "(empty)";
    if ((pcVar6 != (char *)0x0) && (pcVar5 = "(empty)", *pcVar6 != '\0')) {
      pwVar2 = ct_decode_string(pcVar6,&el->el_scratch);
      pwVar2 = ct_visual_string(pwVar2,&el->el_visual);
      pcVar5 = ct_encode_string(pwVar2,&el->el_scratch);
    }
    fprintf((FILE *)el->el_outfile,"\t%25s (%s) == %s\n",ptVar7->long_name,pcVar3,pcVar5);
    ppcVar4 = ppcVar4 + 1;
  }
  fputc(10,(FILE *)el->el_outfile);
  return L'\0';
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_telltc(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv __attribute__((__unused__)))
{
	const struct termcapstr *t;
	char **ts;

	(void) fprintf(el->el_outfile, "\n\tYour terminal has the\n");
	(void) fprintf(el->el_outfile, "\tfollowing characteristics:\n\n");
	(void) fprintf(el->el_outfile, "\tIt has %d columns and %d lines\n",
	    Val(T_co), Val(T_li));
	(void) fprintf(el->el_outfile,
	    "\tIt has %s meta key\n", EL_HAS_META ? "a" : "no");
	(void) fprintf(el->el_outfile,
	    "\tIt can%suse tabs\n", EL_CAN_TAB ? " " : "not ");
	(void) fprintf(el->el_outfile, "\tIt %s automatic margins\n",
	    EL_HAS_AUTO_MARGINS ? "has" : "does not have");
	if (EL_HAS_AUTO_MARGINS)
		(void) fprintf(el->el_outfile, "\tIt %s magic margins\n",
		    EL_HAS_MAGIC_MARGINS ? "has" : "does not have");

	for (t = tstr, ts = el->el_terminal.t_str; t->name != NULL; t++, ts++) {
		const char *ub;
		if (*ts && **ts) {
			ub = ct_encode_string(ct_visual_string(
			    ct_decode_string(*ts, &el->el_scratch),
			    &el->el_visual), &el->el_scratch);
		} else {
			ub = "(empty)";
		}
		(void) fprintf(el->el_outfile, "\t%25s (%s) == %s\n",
		    t->long_name, t->name, ub);
	}
	(void) fputc('\n', el->el_outfile);
	return 0;
}